

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O0

char * __thiscall
Database::query(Database *this,char mktsegmentCondition,uint16_t orderdateCondition,
               uint16_t shipdateCondition,uint16_t topn)

{
  uint32_t orderkey;
  char *pcVar1;
  ushort in_CX;
  ushort in_DX;
  char in_SIL;
  MaxHeap *in_RDI;
  uint32_t eps;
  uint32_t joinkey;
  uint32_t l_position;
  uint32_t pos;
  MaxHeap heap;
  uint32_t A_LENGTH;
  int p;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t uVar2;
  uint uVar3;
  uint16_t orderdate;
  uint local_50;
  uint local_3c;
  MaxHeap local_38;
  uint local_18;
  int local_14;
  ushort local_e;
  ushort local_c;
  
  local_e = in_CX;
  local_c = in_DX;
  local_14 = util::get_key_index(in_SIL);
  local_18 = **(uint **)(&in_RDI[5].size + (long)local_14 * 4);
  MaxHeap::MaxHeap((MaxHeap *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (uint16_t)((ulong)in_stack_ffffffffffffff88 >> 0x30));
  for (local_3c = 1; local_3c <= local_18; local_3c = local_3c + 1) {
    uVar3 = (&in_RDI[4].c3Result)[local_14][local_3c];
    orderkey = MaxHeap::top(&local_38);
    if (uVar3 <= orderkey) break;
    if (*(ushort *)(*(long *)(&in_RDI->size + (long)local_14 * 4) + (ulong)local_3c * 2) < local_c)
    {
      orderdate = (uint16_t)(uVar3 >> 0x10);
      if (local_e < *(ushort *)((long)(&in_RDI[2].c1Result)[local_14] + (ulong)local_3c * 2)) {
        MaxHeap::insert(in_RDI,orderkey,orderdate,in_stack_ffffffffffffff94);
      }
      else if (local_e < (&in_RDI[3].c2Result)[local_14][local_3c]) {
        local_50 = (&in_RDI[7].c1Result)[local_14][local_3c];
        uVar2 = in_stack_ffffffffffffff94;
        while( true ) {
          in_stack_ffffffffffffff94 = uVar2 & 0xffffff;
          if (local_50 < 0xb2d0cc52) {
            in_stack_ffffffffffffff94 =
                 CONCAT13(in_RDI->c1Result[local_50] ==
                          *(uint32_t *)
                           (*(long *)(&in_RDI[5].size + (long)local_14 * 4) + (ulong)local_3c * 4),
                          (int3)uVar2);
          }
          if ((char)(in_stack_ffffffffffffff94 >> 0x18) == '\0') break;
          local_50 = local_50 + 1;
          uVar2 = in_stack_ffffffffffffff94;
        }
        MaxHeap::insert(in_RDI,orderkey,orderdate,in_stack_ffffffffffffff94);
      }
    }
  }
  pcVar1 = MaxHeap::getResults(in_RDI);
  MaxHeap::~MaxHeap(in_RDI);
  return pcVar1;
}

Assistant:

inline char* query(char mktsegmentCondition, uint16_t orderdateCondition, uint16_t shipdateCondition, uint16_t topn) {
    auto p = util::get_key_index(mktsegmentCondition);
    auto A_LENGTH = a_orderkey[p][0];
    MaxHeap heap(topn);
    for (uint32_t pos = 1; pos <= A_LENGTH; ++pos) {
      if (a_extendedpricesum[p][pos] <= heap.top()) {  // early stop
        break;
      }
      if (a_orderdate[p][pos] < orderdateCondition) {
        if (a_minshipdate[p][pos] > shipdateCondition) {
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], a_extendedpricesum[p][pos]);
        } else if (a_maxshipdate[p][pos] > shipdateCondition) { // lookup lineitem table
          uint32_t l_position = a_lineitemposition[p][pos];
          uint32_t joinkey = a_orderkey[p][pos];
          uint32_t eps = 0;
          while (l_position < LINEITEM && l_orderkey[l_position] == joinkey) {
            if (l_shipdate[l_position] > shipdateCondition) {
              eps += l_extendedprice[l_position];
            }
            ++l_position;
          }
          heap.insert(a_orderkey[p][pos], a_orderdate[p][pos], eps);
        }
      }
    }
    return heap.getResults();
  }